

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_CryptoError.cpp
# Opt level: O0

void axl::cry::registerCryptoErrorProviders(void)

{
  ErrorMgr *flag;
  ErrorProvider *in_stack_00000020;
  Guid *in_stack_00000028;
  ErrorMgr *in_stack_00000030;
  
  flag = err::getErrorMgr();
  sl::getSimpleSingleton<axl::cry::CryptoErrorProvider>((int32_t *)flag);
  err::ErrorMgr::registerProvider(in_stack_00000030,in_stack_00000028,in_stack_00000020);
  err::getErrorMgr();
  sl::getSimpleSingleton<axl::cry::X509ErrorProvider>((int32_t *)flag);
  err::ErrorMgr::registerProvider(in_stack_00000030,in_stack_00000028,in_stack_00000020);
  OPENSSL_init_crypto(2,0);
  return;
}

Assistant:

void
registerCryptoErrorProviders() {
	err::getErrorMgr()->registerProvider(
		g_cryptoErrorGuid,
		sl::getSimpleSingleton<CryptoErrorProvider> ()
	);

	err::getErrorMgr()->registerProvider(
		g_x509ErrorGuid,
		sl::getSimpleSingleton<X509ErrorProvider> ()
	);

	ERR_load_crypto_strings();
}